

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPReductionClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPReductionClause *this)

{
  ulong uVar1;
  string local_a0;
  string local_80;
  OpenMPReductionClauseIdentifier local_5c;
  OpenMPReductionClauseModifier local_58;
  OpenMPReductionClauseIdentifier identifier;
  OpenMPReductionClauseModifier modifier;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPReductionClause *local_18;
  OpenMPReductionClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPReductionClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"reduction ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&modifier,"(",(allocator<char> *)((long)&identifier + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&identifier + 3));
  local_58 = getModifier(this);
  local_5c = getIdentifier(this);
  if (local_58 == OMPC_REDUCTION_MODIFIER_inscan) {
    std::__cxx11::string::operator+=((string *)&modifier,"inscan");
  }
  else if (local_58 == OMPC_REDUCTION_MODIFIER_task) {
    std::__cxx11::string::operator+=((string *)&modifier,"task");
  }
  else if (local_58 == OMPC_REDUCTION_MODIFIER_default) {
    std::__cxx11::string::operator+=((string *)&modifier,"default");
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&modifier,", ");
  }
  switch(local_5c) {
  case OMPC_REDUCTION_IDENTIFIER_plus:
    std::__cxx11::string::operator+=((string *)&modifier,"+");
    break;
  case OMPC_REDUCTION_IDENTIFIER_minus:
    std::__cxx11::string::operator+=((string *)&modifier,"-");
    break;
  case OMPC_REDUCTION_IDENTIFIER_mul:
    std::__cxx11::string::operator+=((string *)&modifier,"*");
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitand:
    std::__cxx11::string::operator+=((string *)&modifier,"&");
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitor:
    std::__cxx11::string::operator+=((string *)&modifier,"|");
    break;
  case OMPC_REDUCTION_IDENTIFIER_bitxor:
    std::__cxx11::string::operator+=((string *)&modifier,"^");
    break;
  case OMPC_REDUCTION_IDENTIFIER_logand:
    std::__cxx11::string::operator+=((string *)&modifier,"&&");
    break;
  case OMPC_REDUCTION_IDENTIFIER_logor:
    std::__cxx11::string::operator+=((string *)&modifier,"||");
    break;
  default:
    break;
  case OMPC_REDUCTION_IDENTIFIER_max:
    std::__cxx11::string::operator+=((string *)&modifier,"max");
    break;
  case OMPC_REDUCTION_IDENTIFIER_min:
    std::__cxx11::string::operator+=((string *)&modifier,"min");
    break;
  case OMPC_REDUCTION_IDENTIFIER_user:
    getUserDefinedIdentifier_abi_cxx11_(&local_80,this);
    std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    std::__cxx11::string::operator+=((string *)&modifier," : ");
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_a0,&this->super_OpenMPClause);
  std::__cxx11::string::operator+=((string *)&modifier,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::operator+=((string *)&modifier,") ");
  uVar1 = std::__cxx11::string::size();
  if (3 < uVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPReductionClause::toString() {

    std::string result = "reduction ";
    std::string clause_string = "(";
    OpenMPReductionClauseModifier modifier = this->getModifier();
    OpenMPReductionClauseIdentifier identifier = this->getIdentifier();
    switch (modifier) {
        case OMPC_REDUCTION_MODIFIER_default:
            clause_string += "default";
            break;
        case OMPC_REDUCTION_MODIFIER_inscan:
            clause_string += "inscan";
            break;
        case OMPC_REDUCTION_MODIFIER_task:
            clause_string += "task";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += ", ";
    };
    switch (identifier) {
        case OMPC_REDUCTION_IDENTIFIER_plus:
            clause_string += "+";
            break;
        case OMPC_REDUCTION_IDENTIFIER_minus:
            clause_string += "-";
            break;
        case OMPC_REDUCTION_IDENTIFIER_mul:
            clause_string += "*";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitand:
            clause_string += "&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitor:
            clause_string += "|";
            break;
        case OMPC_REDUCTION_IDENTIFIER_bitxor:
            clause_string += "^";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logand:
            clause_string += "&&";
            break;
        case OMPC_REDUCTION_IDENTIFIER_logor:
            clause_string += "||";
            break;
        case OMPC_REDUCTION_IDENTIFIER_min:
            clause_string += "min";
            break;
        case OMPC_REDUCTION_IDENTIFIER_max:
            clause_string += "max";
            break;
        case OMPC_REDUCTION_IDENTIFIER_user:
            clause_string += this->getUserDefinedIdentifier();
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}